

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O1

int InputTextCallback(ImGuiInputTextCallbackData *data)

{
  ulong *puVar1;
  undefined8 *puVar2;
  code *UNRECOVERED_JUMPTABLE;
  int iVar3;
  
  puVar1 = (ulong *)data->UserData;
  if (data->EventFlag == 0x40000) {
    puVar2 = (undefined8 *)*puVar1;
    std::__cxx11::string::resize((ulong)puVar2,(char)data->BufTextLen);
    data->Buf = (char *)*puVar2;
  }
  else {
    UNRECOVERED_JUMPTABLE = (code *)puVar1[1];
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      data->UserData = (void *)puVar1[2];
      iVar3 = (*UNRECOVERED_JUMPTABLE)(data);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static int InputTextCallback(ImGuiInputTextCallbackData* data)
{
    InputTextCallback_UserData* user_data = (InputTextCallback_UserData*)data->UserData;
    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
    {
        // Resize string callback
        // If for some reason we refuse the new length (BufTextLen) and/or capacity (BufSize) we need to set them back to what we want.
        std::string* str = user_data->Str;
        IM_ASSERT(data->Buf == str->c_str());
        str->resize(data->BufTextLen);
        data->Buf = (char*)str->c_str();
    }
    else if (user_data->ChainCallback)
    {
        // Forward to user callback, if any
        data->UserData = user_data->ChainCallbackUserData;
        return user_data->ChainCallback(data);
    }
    return 0;
}